

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion_tests.cpp
# Opt level: O0

void skiwi::anon_unknown_31::tail_calls_analysis(void)

{
  byte bVar1;
  iterator __first;
  Program local_178;
  token *local_118;
  __normal_iterator<skiwi::token_*,_std::vector<skiwi::token,_std::allocator<skiwi::token>_>_>
  local_110;
  allocator<char> local_101;
  string local_100 [32];
  vector<skiwi::token,_std::allocator<skiwi::token>_> local_e0;
  undefined1 local_c8 [8];
  Program prog;
  allocator<char> local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  vector<skiwi::token,_std::allocator<skiwi::token>_> tokens;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_40,"(define fact (lambda (x) (if (= x 0) 1 ( * x ( fact (- x 1))))))",&local_41);
  skiwi::tokenize((string *)local_20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  __first = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::begin
                      ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_20);
  prog._88_8_ = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::end
                          ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_20);
  std::
  reverse<__gnu_cxx::__normal_iterator<skiwi::token*,std::vector<skiwi::token,std::allocator<skiwi::token>>>>
            ((__normal_iterator<skiwi::token_*,_std::vector<skiwi::token,_std::allocator<skiwi::token>_>_>
              )__first._M_current,
             (__normal_iterator<skiwi::token_*,_std::vector<skiwi::token,_std::allocator<skiwi::token>_>_>
              )prog._88_8_);
  skiwi::make_program((vector *)local_c8);
  skiwi::tail_call_analysis((Program *)local_c8);
  bVar1 = skiwi::only_tail_calls((Program *)local_c8);
  TestEq<bool,bool>(true,(bool)(~bVar1 & 1),
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/conversion_tests.cpp"
                    ,0x120,"void skiwi::(anonymous namespace)::tail_calls_analysis()");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_100,
             "(define fact (lambda (x) (define fact-tail (lambda (x accum) (if (= x 0) accum (fact-tail (- x 1) (* x accum))))) (fact-tail x 1) ) )"
             ,&local_101);
  skiwi::tokenize((string *)&local_e0);
  std::vector<skiwi::token,_std::allocator<skiwi::token>_>::operator=
            ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_20,&local_e0);
  std::vector<skiwi::token,_std::allocator<skiwi::token>_>::~vector(&local_e0);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  local_110._M_current =
       (token *)std::vector<skiwi::token,_std::allocator<skiwi::token>_>::begin
                          ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_20);
  local_118 = (token *)std::vector<skiwi::token,_std::allocator<skiwi::token>_>::end
                                 ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_20);
  std::
  reverse<__gnu_cxx::__normal_iterator<skiwi::token*,std::vector<skiwi::token,std::allocator<skiwi::token>>>>
            (local_110,
             (__normal_iterator<skiwi::token_*,_std::vector<skiwi::token,_std::allocator<skiwi::token>_>_>
              )local_118);
  skiwi::make_program((vector *)&local_178);
  Program::operator=((Program *)local_c8,&local_178);
  Program::~Program(&local_178);
  skiwi::tail_call_analysis((Program *)local_c8);
  bVar1 = skiwi::only_tail_calls((Program *)local_c8);
  TestEq<bool,bool>(true,(bool)(bVar1 & 1),
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/conversion_tests.cpp"
                    ,0x126,"void skiwi::(anonymous namespace)::tail_calls_analysis()");
  Program::~Program((Program *)local_c8);
  std::vector<skiwi::token,_std::allocator<skiwi::token>_>::~vector
            ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_20);
  return;
}

Assistant:

void tail_calls_analysis()
    {
    auto tokens = tokenize("(define fact (lambda (x) (if (= x 0) 1 ( * x ( fact (- x 1))))))");
    std::reverse(tokens.begin(), tokens.end());
    auto prog = make_program(tokens);
    tail_call_analysis(prog);
    TEST_ASSERT(!only_tail_calls(prog));

    tokens = tokenize("(define fact (lambda (x) (define fact-tail (lambda (x accum) (if (= x 0) accum (fact-tail (- x 1) (* x accum))))) (fact-tail x 1) ) )");
    std::reverse(tokens.begin(), tokens.end());
    prog = make_program(tokens);
    tail_call_analysis(prog);
    TEST_ASSERT(only_tail_calls(prog));
    }